

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O0

char * TiXmlBase::SkipWhiteSpace(char *p,TiXmlEncoding encoding)

{
  bool bVar1;
  bool local_29;
  uchar *pU;
  char *pcStack_18;
  TiXmlEncoding encoding_local;
  char *p_local;
  
  if ((p == (char *)0x0) || (*p == '\0')) {
    p_local = (char *)0x0;
  }
  else {
    pcStack_18 = p;
    if (encoding == TIXML_ENCODING_UTF8) {
      while (*pcStack_18 != '\0') {
        if (((*pcStack_18 == -0x11) && (pcStack_18[1] == -0x45)) && (pcStack_18[2] == -0x41)) {
          pcStack_18 = pcStack_18 + 3;
        }
        else if (((*pcStack_18 == -0x11) && (pcStack_18[1] == -0x41)) && (pcStack_18[2] == -0x42)) {
          pcStack_18 = pcStack_18 + 3;
        }
        else if (((*pcStack_18 == -0x11) && (pcStack_18[1] == -0x41)) && (pcStack_18[2] == -0x41)) {
          pcStack_18 = pcStack_18 + 3;
        }
        else {
          bVar1 = IsWhiteSpace(*pcStack_18);
          if (!bVar1) break;
          pcStack_18 = pcStack_18 + 1;
        }
      }
    }
    else {
      while( true ) {
        local_29 = false;
        if (*pcStack_18 != '\0') {
          local_29 = IsWhiteSpace(*pcStack_18);
        }
        if (local_29 == false) break;
        pcStack_18 = pcStack_18 + 1;
      }
    }
    p_local = pcStack_18;
  }
  return p_local;
}

Assistant:

const char* TiXmlBase::SkipWhiteSpace( const char* p, TiXmlEncoding encoding )
{
	if ( !p || !*p )
	{
		return 0;
	}
	if ( encoding == TIXML_ENCODING_UTF8 )
	{
		while ( *p )
		{
			const unsigned char* pU = (const unsigned char*)p;
			
			// Skip the stupid Microsoft UTF-8 Byte order marks
			if (	*(pU+0)==TIXML_UTF_LEAD_0
				 && *(pU+1)==TIXML_UTF_LEAD_1 
				 && *(pU+2)==TIXML_UTF_LEAD_2 )
			{
				p += 3;
				continue;
			}
			else if(*(pU+0)==TIXML_UTF_LEAD_0
				 && *(pU+1)==0xbfU
				 && *(pU+2)==0xbeU )
			{
				p += 3;
				continue;
			}
			else if(*(pU+0)==TIXML_UTF_LEAD_0
				 && *(pU+1)==0xbfU
				 && *(pU+2)==0xbfU )
			{
				p += 3;
				continue;
			}

			if ( IsWhiteSpace( *p ) )		// Still using old rules for white space.
				++p;
			else
				break;
		}
	}
	else
	{
		while ( *p && IsWhiteSpace( *p ) )
			++p;
	}

	return p;
}